

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operands.c
# Opt level: O0

int GetAReg(char *op,int len,int loc)

{
  int iVar1;
  int i;
  int loc_local;
  int len_local;
  char *op_local;
  
  iVar1 = IsRegister(op,len);
  if ((iVar1 < 8) || (0xf < iVar1)) {
    Error(loc,8);
    op_local._4_4_ = 0;
  }
  else {
    op_local._4_4_ = iVar1 + -8;
  }
  return op_local._4_4_;
}

Assistant:

int 
GetAReg (char *op, int len, int loc)
/* Validate an address register specification.
 Valid specifications are A0 through A7, SP, or an EQUR label.
 The address register number will be returned if it is valid.
 Otherwise, Error will be called, using "loc" for the error
 location (this is its only use), and zero (A0) will be returned. */
{
	register int i;

	i = IsRegister(op, len); /* Get register number. */
	if ((i >= 8) && (i <= 15))
		return (i - 8); /* Valid address register */
	else {
		Error(loc, AddrErr); /* Not an address register */
		return (0); /* Set to A0. */
	}
}